

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *vec)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  fpclass_type fVar5;
  pointer pnVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int32_t iVar10;
  type_conflict5 tVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  uint *puVar18;
  uint *puVar19;
  int iVar20;
  int *piVar21;
  byte bVar22;
  int *local_288;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar22 = 0;
  local_b8.fpclass = cpp_dec_float_finite;
  local_b8.prec_elem = 0x1c;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems[6] = 0;
  local_b8.data._M_elems[7] = 0;
  local_b8.data._M_elems[8] = 0;
  local_b8.data._M_elems[9] = 0;
  local_b8.data._M_elems[10] = 0;
  local_b8.data._M_elems[0xb] = 0;
  local_b8.data._M_elems[0xc] = 0;
  local_b8.data._M_elems[0xd] = 0;
  local_b8.data._M_elems[0xe] = 0;
  local_b8.data._M_elems[0xf] = 0;
  local_b8.data._M_elems[0x10] = 0;
  local_b8.data._M_elems[0x11] = 0;
  local_b8.data._M_elems[0x12] = 0;
  local_b8.data._M_elems[0x13] = 0;
  local_b8.data._M_elems[0x14] = 0;
  local_b8.data._M_elems[0x15] = 0;
  local_b8.data._M_elems[0x16] = 0;
  local_b8.data._M_elems[0x17] = 0;
  local_b8.data._M_elems[0x18] = 0;
  local_b8.data._M_elems[0x19] = 0;
  local_b8.data._M_elems._104_5_ = 0;
  local_b8.data._M_elems[0x1b]._1_3_ = 0;
  local_b8.exp = 0;
  local_b8.neg = false;
  pnVar6 = (this->l).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar7 = (this->l).idx;
  piVar8 = (this->l).row;
  piVar9 = (this->l).start;
  uVar2 = (this->l).firstUpdate;
  uVar15 = 0;
  uVar14 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar14 = uVar15;
  }
  for (; uVar15 != uVar14; uVar15 = uVar15 + 1) {
    iVar3 = piVar8[uVar15];
    pnVar17 = vec + iVar3;
    pcVar16 = &local_b8;
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      (((cpp_dec_float<200U,_int,_void> *)&pcVar16->data)->data)._M_elems[0] =
           (pnVar17->m_backend).data._M_elems[0];
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_b8.exp = vec[iVar3].m_backend.exp;
    local_b8.neg = vec[iVar3].m_backend.neg;
    local_b8.fpclass = vec[iVar3].m_backend.fpclass;
    local_b8.prec_elem = vec[iVar3].m_backend.prec_elem;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    tVar11 = boost::multiprecision::operator!=
                       ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_b8,(double *)&result);
    if (tVar11) {
      iVar3 = piVar9[uVar15];
      local_288 = piVar7 + iVar3;
      pcVar16 = &pnVar6[iVar3].m_backend;
      for (iVar12 = piVar9[uVar15 + 1]; iVar3 < iVar12; iVar12 = iVar12 + -1) {
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems[8] = 0;
        result.m_backend.data._M_elems[9] = 0;
        result.m_backend.data._M_elems[10] = 0;
        result.m_backend.data._M_elems[0xb] = 0;
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems[0xe] = 0;
        result.m_backend.data._M_elems[0xf] = 0;
        result.m_backend.data._M_elems[0x10] = 0;
        result.m_backend.data._M_elems[0x11] = 0;
        result.m_backend.data._M_elems[0x12] = 0;
        result.m_backend.data._M_elems[0x13] = 0;
        result.m_backend.data._M_elems[0x14] = 0;
        result.m_backend.data._M_elems[0x15] = 0;
        result.m_backend.data._M_elems[0x16] = 0;
        result.m_backend.data._M_elems[0x17] = 0;
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result.m_backend,&local_b8,pcVar16);
        iVar20 = *local_288;
        local_138.fpclass = cpp_dec_float_finite;
        local_138.prec_elem = 0x1c;
        local_138.data._M_elems[0] = 0;
        local_138.data._M_elems[1] = 0;
        local_138.data._M_elems[2] = 0;
        local_138.data._M_elems[3] = 0;
        local_138.data._M_elems[4] = 0;
        local_138.data._M_elems[5] = 0;
        local_138.data._M_elems[6] = 0;
        local_138.data._M_elems[7] = 0;
        local_138.data._M_elems[8] = 0;
        local_138.data._M_elems[9] = 0;
        local_138.data._M_elems[10] = 0;
        local_138.data._M_elems[0xb] = 0;
        local_138.data._M_elems[0xc] = 0;
        local_138.data._M_elems[0xd] = 0;
        local_138.data._M_elems[0xe] = 0;
        local_138.data._M_elems[0xf] = 0;
        local_138.data._M_elems[0x10] = 0;
        local_138.data._M_elems[0x11] = 0;
        local_138.data._M_elems[0x12] = 0;
        local_138.data._M_elems[0x13] = 0;
        local_138.data._M_elems[0x14] = 0;
        local_138.data._M_elems[0x15] = 0;
        local_138.data._M_elems[0x16] = 0;
        local_138.data._M_elems[0x17] = 0;
        local_138.data._M_elems[0x18] = 0;
        local_138.data._M_elems[0x19] = 0;
        local_138.data._M_elems._104_5_ = 0;
        local_138.data._M_elems[0x1b]._1_3_ = 0;
        local_138.exp = 0;
        local_138.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_138,&local_b8,pcVar16);
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems[0xe] = 0;
        result_1.m_backend.data._M_elems[0xf] = 0;
        result_1.m_backend.data._M_elems[0x10] = 0;
        result_1.m_backend.data._M_elems[0x11] = 0;
        result_1.m_backend.data._M_elems[0x12] = 0;
        result_1.m_backend.data._M_elems[0x13] = 0;
        result_1.m_backend.data._M_elems[0x14] = 0;
        result_1.m_backend.data._M_elems[0x15] = 0;
        result_1.m_backend.data._M_elems[0x16] = 0;
        result_1.m_backend.data._M_elems[0x17] = 0;
        result_1.m_backend.data._M_elems[0x18] = 0;
        result_1.m_backend.data._M_elems[0x19] = 0;
        result_1.m_backend.data._M_elems._104_5_ = 0;
        result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_1.m_backend,&vec[iVar20].m_backend,&local_138);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems[8] = 0;
        result.m_backend.data._M_elems[9] = 0;
        result.m_backend.data._M_elems[10] = 0;
        result.m_backend.data._M_elems[0xb] = 0;
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems[0xe] = 0;
        result.m_backend.data._M_elems[0xf] = 0;
        result.m_backend.data._M_elems[0x10] = 0;
        result.m_backend.data._M_elems[0x11] = 0;
        result.m_backend.data._M_elems[0x12] = 0;
        result.m_backend.data._M_elems[0x13] = 0;
        result.m_backend.data._M_elems[0x14] = 0;
        result.m_backend.data._M_elems[0x15] = 0;
        result.m_backend.data._M_elems[0x16] = 0;
        result.m_backend.data._M_elems[0x17] = 0;
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result.m_backend,&local_b8,pcVar16);
        iVar20 = *local_288;
        local_288 = local_288 + 1;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&vec[iVar20].m_backend,&result.m_backend);
        pcVar16 = pcVar16 + 1;
      }
    }
  }
  if ((this->l).updateType != 0) {
    iVar3 = (this->l).firstUnused;
    puVar1 = result.m_backend.data._M_elems + 1;
    while (lVar13 = 0x1b, (long)uVar14 < (long)iVar3) {
      iVar12 = piVar9[uVar14];
      piVar21 = piVar7 + iVar12;
      pnVar17 = vec + piVar8[uVar14];
      uVar2 = (pnVar17->m_backend).data._M_elems[0];
      puVar18 = (pnVar17->m_backend).data._M_elems + 1;
      puVar19 = puVar1;
      for (; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar19 = *puVar18;
        puVar18 = puVar18 + (ulong)bVar22 * -2 + 1;
        puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
      }
      result.m_backend.data._M_elems[0] = uVar2;
      result.m_backend.exp = (pnVar17->m_backend).exp;
      fVar5 = (pnVar17->m_backend).fpclass;
      iVar10 = (pnVar17->m_backend).prec_elem;
      result.m_backend.neg =
           (bool)((uVar2 != 0 || fVar5 != cpp_dec_float_finite) ^ (pnVar17->m_backend).neg);
      result.m_backend.fpclass = fVar5;
      result.m_backend.prec_elem = iVar10;
      pcVar16 = &pnVar6[iVar12].m_backend;
      for (iVar20 = piVar9[uVar14 + 1]; iVar12 < iVar20; iVar20 = iVar20 + -1) {
        iVar4 = *piVar21;
        piVar21 = piVar21 + 1;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems[0xe] = 0;
        result_1.m_backend.data._M_elems[0xf] = 0;
        result_1.m_backend.data._M_elems[0x10] = 0;
        result_1.m_backend.data._M_elems[0x11] = 0;
        result_1.m_backend.data._M_elems[0x12] = 0;
        result_1.m_backend.data._M_elems[0x13] = 0;
        result_1.m_backend.data._M_elems[0x14] = 0;
        result_1.m_backend.data._M_elems[0x15] = 0;
        result_1.m_backend.data._M_elems[0x16] = 0;
        result_1.m_backend.data._M_elems[0x17] = 0;
        result_1.m_backend.data._M_elems[0x18] = 0;
        result_1.m_backend.data._M_elems[0x19] = 0;
        result_1.m_backend.data._M_elems._104_5_ = 0;
        result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_1.m_backend,&vec[iVar4].m_backend,pcVar16);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (&result.m_backend,&result_1.m_backend);
        pcVar16 = pcVar16 + 1;
      }
      pnVar17 = vec + piVar8[uVar14];
      (pnVar17->m_backend).data._M_elems[0] = result.m_backend.data._M_elems[0];
      puVar18 = puVar1;
      puVar19 = (pnVar17->m_backend).data._M_elems + 1;
      for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar19 = *puVar18;
        puVar18 = puVar18 + (ulong)bVar22 * -2 + 1;
        puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
      }
      (pnVar17->m_backend).exp = result.m_backend.exp;
      (pnVar17->m_backend).neg =
           (bool)((result.m_backend.data._M_elems[0] != 0 ||
                  result.m_backend.fpclass != cpp_dec_float_finite) ^ result.m_backend.neg);
      (pnVar17->m_backend).fpclass = result.m_backend.fpclass;
      (pnVar17->m_backend).prec_elem = result.m_backend.prec_elem;
      uVar14 = uVar14 + 1;
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLright(R* vec)
{
   int i, j, k;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = 0; i < end; ++i)
   {
      if((x = vec[lrow[i]]) != 0.0)
      {
         SPxOut::debug(this, "y{}={}\n", lrow[i], vec[lrow[i]]);

         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            SPxOut::debug(this, "                         -> y{} -= {} * {} = {}    -> {}\n", *idx, x, *val,
                          x * (*val), vec[*idx] - x * (*val));
            vec[*idx++] -= x * (*val++);
         }
      }
   }

   if(l.updateType)                      /* Forest-Tomlin Updates */
   {
      SPxOut::debug(this, "performing FT updates...\n");

      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);
         StableSum<R> tmp(-vec[lrow[i]]);

         for(j = lbeg[i + 1]; j > k; --j)
            tmp += vec[*idx++] * (*val++);

         vec[lrow[i]] = -R(tmp);

         SPxOut::debug(this, "y{}={}\n", lrow[i], vec[lrow[i]]);
      }

      SPxOut::debug(this, "finished FT updates.\n");
   }
}